

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

bool __thiscall HEkk::lpFactorRowCompatible(HEkk *this,HighsInt expectedNumRow)

{
  uint uVar1;
  
  uVar1 = (this->simplex_nla_).factor_.num_row;
  if (uVar1 != expectedNumRow) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                "HEkk::initialiseSimplexLpBasisAndFactor: LP(%6d, %6d) has factor_num_row = %d\n",
                (ulong)(uint)(this->lp_).num_col_,expectedNumRow,(ulong)uVar1);
  }
  return uVar1 == expectedNumRow;
}

Assistant:

bool HEkk::lpFactorRowCompatible(const HighsInt expectedNumRow) const {
  // Check for LP-HFactor row compatibility
  const bool consistent_num_row =
      this->simplex_nla_.factor_.num_row == expectedNumRow;
  if (!consistent_num_row) {
    highsLogDev(options_->log_options, HighsLogType::kError,
                "HEkk::initialiseSimplexLpBasisAndFactor: LP(%6d, %6d) has "
                "factor_num_row = %d\n",
                (int)this->lp_.num_col_, expectedNumRow,
                (int)this->simplex_nla_.factor_.num_row);
  }
  return consistent_num_row;
}